

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

BytesToSend * __thiscall
V2Transport::GetBytesToSend_abi_cxx11_(V2Transport *this,bool have_next_message)

{
  long lVar1;
  Mutex *file;
  Span<const_unsigned_char> *this_00;
  undefined1 in_DL;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  V1Transport *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock51;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  V1Transport *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined3 in_stack_ffffffffffffffa4;
  uint uVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_02;
  undefined1 in_stack_ffffffffffffffef;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffa4) & 0x1ffffff;
  this_01 = in_RDI;
  this_02 = in_RSI;
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff78,
             (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,(Mutex *)0xffeb14);
  file = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_02,(AnnotatedMixin<std::mutex> *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
             (char *)in_RSI,(char *)this_01,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  if (*(char *)&in_RSI[0x5a].super_unique_lock._M_device == '\x03') {
    V1Transport::GetBytesToSend_abi_cxx11_(this_01,(bool)in_stack_ffffffffffffffef);
  }
  else {
    if (*(char *)&in_RSI[0x5a].super_unique_lock._M_device == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(in_stack_ffffffffffffff78);
      inline_assertion_check<false,bool>
                ((bool *)in_RDI,(char *)file,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    this_00 = (Span<const_unsigned_char> *)(ulong)*(uint *)&in_RSI[0x56].super_unique_lock._M_device
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    inline_assertion_check<false,bool>
              ((bool *)in_RDI,(char *)file,(int)((ulong)this_00 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (type)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Span<const_unsigned_char>::subspan
              (this_00,CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar2 = false;
    if ((uVar3 & 0x1000000) != 0) {
      bVar2 = *(char *)&in_RSI[0x5a].super_unique_lock._M_device == '\x02';
    }
    std::
    tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::
    tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00,(Span<const_unsigned_char> *)CONCAT17(bVar2,in_stack_ffffffffffffff70),
               (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffecb7);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (BytesToSend *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

Transport::BytesToSend V2Transport::GetBytesToSend(bool have_next_message) const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.GetBytesToSend(have_next_message);

    if (m_send_state == SendState::MAYBE_V1) Assume(m_send_buffer.empty());
    Assume(m_send_pos <= m_send_buffer.size());
    return {
        Span{m_send_buffer}.subspan(m_send_pos),
        // We only have more to send after the current m_send_buffer if there is a (next)
        // message to be sent, and we're capable of sending packets. */
        have_next_message && m_send_state == SendState::READY,
        m_send_type
    };
}